

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

_Bool Curl_conn_data_pending(connectdata *conn,int sockindex)

{
  _Bool _Var1;
  uint uVar2;
  bool local_21;
  int readable;
  int sockindex_local;
  connectdata *conn_local;
  
  _Var1 = Curl_ssl_data_pending(conn,sockindex);
  if ((_Var1) || (_Var1 = Curl_recv_has_postponed_data(conn,sockindex), _Var1)) {
    conn_local._7_1_ = true;
  }
  else {
    uVar2 = Curl_socket_check(conn->sock[sockindex],-1,-1,0);
    local_21 = 0 < (int)uVar2 && (uVar2 & 1) != 0;
    conn_local._7_1_ = local_21;
  }
  return conn_local._7_1_;
}

Assistant:

bool Curl_conn_data_pending(struct connectdata *conn, int sockindex)
{
  int readable;
  DEBUGASSERT(conn);

  if(Curl_ssl_data_pending(conn, sockindex) ||
     Curl_recv_has_postponed_data(conn, sockindex))
    return true;

  readable = SOCKET_READABLE(conn->sock[sockindex], 0);
  return (readable > 0 && (readable & CURL_CSELECT_IN));
}